

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

rotation_t *
opengv::relative_pose::rotationOnly
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  size_t sVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  rotation_t *prVar13;
  ulong uVar14;
  double *pdVar15;
  Index outer;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  size_t sVar21;
  ulong uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 in_ZMM1 [64];
  MatrixXd Hcross;
  type tmp;
  Vector3d f;
  double local_f8;
  double local_f0;
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  double *local_a8;
  rotation_t *local_a0;
  double local_98 [10];
  undefined1 local_48 [16];
  double local_38;
  
  auVar28 = in_ZMM1._0_16_;
  sVar2 = indices->_numberCorrespondences;
  local_a0 = __return_storage_ptr__;
  if (sVar2 == 0) {
    local_f8 = 0.0;
    local_f0 = 0.0;
    local_c8 = ZEXT816(0);
    local_b8 = ZEXT816(0);
  }
  else {
    local_b8 = ZEXT816(0);
    local_f0 = 0.0;
    lVar18 = 0;
    local_f8 = 0.0;
    sVar21 = 0;
    local_c8 = ZEXT816(0);
    do {
      iVar20 = (int)sVar21;
      iVar17 = iVar20;
      if (indices->_useIndices != false) {
        iVar17 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar18 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(local_98,adapter,(long)iVar17);
      if (indices->_useIndices != false) {
        iVar20 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar18 >> 0x1e));
      }
      local_b8._8_8_ = (double)local_b8._8_8_ + local_98[1];
      local_b8._0_8_ = (double)local_b8._0_8_ + local_98[0];
      local_f8 = local_f8 + local_98[2];
      (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,(long)iVar20);
      auVar28 = in_ZMM1._0_16_;
      local_c8._8_8_ = (double)local_c8._8_8_ + local_98[1];
      local_c8._0_8_ = (double)local_c8._0_8_ + local_98[0];
      local_f0 = local_f0 + local_98[2];
      sVar21 = sVar21 + 1;
      lVar18 = lVar18 + 0x100000000;
    } while (sVar2 != sVar21);
  }
  local_e8.m_data = (double *)0x0;
  local_e8.m_rows = 0;
  local_e8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_e8,9,3,3);
  if ((local_e8.m_rows != 3) || (local_e8.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_e8,9,3,3);
  }
  uVar19 = local_e8.m_rows * local_e8.m_cols;
  uVar16 = uVar19 + 7;
  if (-1 < (long)uVar19) {
    uVar16 = uVar19;
  }
  uVar22 = uVar16 & 0xfffffffffffffff8;
  pdVar15 = local_e8.m_data;
  if (7 < (long)uVar19) {
    uVar14 = 8;
    if (8 < (long)uVar22) {
      uVar14 = uVar22;
    }
    local_a8 = local_e8.m_data;
    memset(local_e8.m_data,0,uVar14 * 8);
    pdVar15 = local_a8;
  }
  if ((long)uVar22 < (long)uVar19) {
    memset(pdVar15 + ((long)uVar16 >> 3) * 8,0,uVar19 * 8 + ((long)uVar16 >> 3) * -0x40);
  }
  if (sVar2 != 0) {
    auVar28 = vcvtusi2sd_avx512f(auVar28,sVar2);
    dVar27 = auVar28._0_8_;
    auVar28._8_8_ = dVar27;
    auVar28._0_8_ = dVar27;
    local_b8 = vdivpd_avx(local_b8,auVar28);
    local_c8 = vdivpd_avx(local_c8,auVar28);
    sVar21 = 0;
    do {
      iVar17 = (int)sVar21;
      iVar20 = iVar17;
      if (indices->_useIndices == true) {
        iVar20 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar17];
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(local_98,adapter,(long)iVar20);
      auVar11._8_8_ = local_98[1];
      auVar11._0_8_ = local_98[0];
      local_48 = vsubpd_avx(auVar11,local_b8);
      local_38 = local_98[2] - local_f8 / dVar27;
      if (indices->_useIndices == true) {
        iVar17 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar17];
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,(long)iVar17);
      auVar12._8_8_ = local_98[1];
      auVar12._0_8_ = local_98[0];
      auVar28 = vsubpd_avx(auVar12,local_c8);
      dVar10 = local_98[2] - local_f0 / dVar27;
      lVar18 = 0;
      pdVar15 = local_98 + 2;
      do {
        dVar1 = *(double *)(local_48 + lVar18 * 8);
        pdVar15[-2] = auVar28._0_8_ * dVar1;
        pdVar15[-1] = auVar28._8_8_ * dVar1;
        *pdVar15 = dVar10 * dVar1;
        lVar18 = lVar18 + 1;
        pdVar15 = pdVar15 + 3;
      } while (lVar18 != 3);
      uVar19 = local_e8.m_cols * local_e8.m_rows;
      uVar16 = uVar19 + 7;
      if (-1 < (long)uVar19) {
        uVar16 = uVar19;
      }
      if (7 < (long)uVar19) {
        lVar18 = 0;
        do {
          auVar23 = vaddpd_avx512f(*(undefined1 (*) [64])(local_98 + lVar18),
                                   *(undefined1 (*) [64])(local_e8.m_data + lVar18));
          *(undefined1 (*) [64])(local_e8.m_data + lVar18) = auVar23;
          lVar18 = lVar18 + 8;
        } while (lVar18 < (long)(uVar16 & 0xfffffffffffffff8));
      }
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if ((long)uVar19 % 8 != 0 && (long)(uVar16 & 0xfffffffffffffff8) <= (long)uVar19) {
        lVar18 = (long)uVar16 >> 3;
        auVar24 = vpbroadcastq_avx512f();
        uVar16 = 0;
        do {
          auVar25 = vpbroadcastq_avx512f();
          auVar25 = vporq_avx512f(auVar25,auVar23);
          uVar22 = vpcmpuq_avx512f(auVar25,auVar24,2);
          pdVar15 = local_98 + lVar18 * 8 + uVar16;
          bVar3 = (byte)uVar22;
          auVar25._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * (long)pdVar15[1];
          auVar25._0_8_ = (ulong)(bVar3 & 1) * (long)*pdVar15;
          auVar25._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * (long)pdVar15[2];
          auVar25._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * (long)pdVar15[3];
          auVar25._32_8_ = (ulong)((byte)(uVar22 >> 4) & 1) * (long)pdVar15[4];
          auVar25._40_8_ = (ulong)((byte)(uVar22 >> 5) & 1) * (long)pdVar15[5];
          auVar25._48_8_ = (ulong)((byte)(uVar22 >> 6) & 1) * (long)pdVar15[6];
          auVar25._56_8_ = (uVar22 >> 7) * (long)pdVar15[7];
          pdVar15 = local_e8.m_data + lVar18 * 8 + uVar16;
          auVar26._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * (long)pdVar15[1];
          auVar26._0_8_ = (ulong)(bVar3 & 1) * (long)*pdVar15;
          auVar26._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * (long)pdVar15[2];
          auVar26._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * (long)pdVar15[3];
          auVar26._32_8_ = (ulong)((byte)(uVar22 >> 4) & 1) * (long)pdVar15[4];
          auVar26._40_8_ = (ulong)((byte)(uVar22 >> 5) & 1) * (long)pdVar15[5];
          auVar26._48_8_ = (ulong)((byte)(uVar22 >> 6) & 1) * (long)pdVar15[6];
          auVar26._56_8_ = (uVar22 >> 7) * (long)pdVar15[7];
          auVar25 = vaddpd_avx512f(auVar25,auVar26);
          pdVar15 = local_e8.m_data + lVar18 * 8 + uVar16;
          bVar4 = (bool)((byte)(uVar22 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar22 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar22 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar22 >> 6) & 1);
          *pdVar15 = (double)((ulong)(bVar3 & 1) * auVar25._0_8_ |
                             (ulong)!(bool)(bVar3 & 1) * (long)*pdVar15);
          pdVar15[1] = (double)((ulong)bVar4 * auVar25._8_8_ | (ulong)!bVar4 * (long)pdVar15[1]);
          pdVar15[2] = (double)((ulong)bVar5 * auVar25._16_8_ | (ulong)!bVar5 * (long)pdVar15[2]);
          pdVar15[3] = (double)((ulong)bVar6 * auVar25._24_8_ | (ulong)!bVar6 * (long)pdVar15[3]);
          pdVar15[4] = (double)((ulong)bVar7 * auVar25._32_8_ | (ulong)!bVar7 * (long)pdVar15[4]);
          pdVar15[5] = (double)((ulong)bVar8 * auVar25._40_8_ | (ulong)!bVar8 * (long)pdVar15[5]);
          pdVar15[6] = (double)((ulong)bVar9 * auVar25._48_8_ | (ulong)!bVar9 * (long)pdVar15[6]);
          pdVar15[7] = (double)((uVar22 >> 7) * auVar25._56_8_ |
                               (ulong)!SUB81(uVar22 >> 7,0) * (long)pdVar15[7]);
          uVar16 = uVar16 + 8;
        } while (((long)uVar19 % 8 + 7U & 0xfffffffffffffff8) != uVar16);
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != sVar2);
  }
  prVar13 = local_a0;
  math::arun(local_a0,(MatrixXd *)&local_e8);
  if (local_e8.m_data != (double *)0x0) {
    free((void *)local_e8.m_data[-1]);
  }
  return prVar13;
}

Assistant:

rotation_t rotationOnly(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 2);

  Eigen::Vector3d pointsCenter1 = Eigen::Vector3d::Zero();
  Eigen::Vector3d pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getBearingVector1(indices[i]);
    pointsCenter2 += adapter.getBearingVector2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f = adapter.getBearingVector1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime =
        adapter.getBearingVector2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  return math::arun(Hcross);
}